

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_SetNonlinearSolver(ARKodeMem ark_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  ARKodeMem in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (in_RSI == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x16,0x30,"mriStep_SetNonlinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                      ,"The NLS input must be non-NULL");
      local_4 = -0x16;
    }
    else if (((*(long *)in_RSI->uround == 0) || (*(long *)((long)in_RSI->uround + 0x18) == 0)) ||
            (*(long *)((long)in_RSI->uround + 0x28) == 0)) {
      arkProcessError(in_RDI,-0x16,0x39,"mriStep_SetNonlinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                      ,"NLS does not support required operations");
      local_4 = -0x16;
    }
    else {
      if ((*(long *)(in_stack_ffffffffffffffe0 + 0xa8) != 0) &&
         (*(int *)(in_stack_ffffffffffffffe0 + 0xb0) != 0)) {
        SUNNonlinSolFree(*(undefined8 *)(in_stack_ffffffffffffffe0 + 0xa8));
      }
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0xa8) = in_RSI;
      in_stack_ffffffffffffffe0[0xb0] = '\0';
      in_stack_ffffffffffffffe0[0xb1] = '\0';
      in_stack_ffffffffffffffe0[0xb2] = '\0';
      in_stack_ffffffffffffffe0[0xb3] = '\0';
      iVar1 = SUNNonlinSolGetType(in_RSI);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetSysFn
                          (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0xa8),mriStep_NlsResidual);
      }
      else {
        iVar1 = SUNNonlinSolGetType(in_RSI);
        if (iVar1 != 1) {
          arkProcessError(in_RDI,-0x16,0x53,"mriStep_SetNonlinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                          ,"Invalid nonlinear solver type");
          return -0x16;
        }
        iVar1 = SUNNonlinSolSetSysFn
                          (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0xa8),mriStep_NlsFPFunction);
      }
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetConvTestFn
                          (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0xa8),mriStep_NlsConvTest,
                           in_RDI);
        if (iVar1 == 0) {
          iVar1 = SUNNonlinSolSetMaxIters
                            (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0xa8),
                             *(undefined4 *)(in_stack_ffffffffffffffe0 + 0x128));
          if (iVar1 == 0) {
            in_stack_ffffffffffffffe0[0xb8] = '\0';
            in_stack_ffffffffffffffe0[0xb9] = '\0';
            in_stack_ffffffffffffffe0[0xba] = '\0';
            in_stack_ffffffffffffffe0[0xbb] = '\0';
            in_stack_ffffffffffffffe0[0xbc] = '\0';
            in_stack_ffffffffffffffe0[0xbd] = '\0';
            in_stack_ffffffffffffffe0[0xbe] = '\0';
            in_stack_ffffffffffffffe0[0xbf] = '\0';
            if (*(int *)(in_stack_ffffffffffffffe0 + 0x1c) != 0) {
              if (*(long *)(in_stack_ffffffffffffffe0 + 8) == 0) {
                arkProcessError(in_RDI,-0x16,0x78,"mriStep_SetNonlinearSolver",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                                ,"The implicit slow ODE RHS function is NULL");
                return -0x16;
              }
              *(undefined8 *)(in_stack_ffffffffffffffe0 + 0xb8) =
                   *(undefined8 *)(in_stack_ffffffffffffffe0 + 8);
            }
            local_4 = 0;
          }
          else {
            arkProcessError(in_RDI,-0x16,0x6c,"mriStep_SetNonlinearSolver",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                            ,"Setting maximum number of nonlinear iterations failed");
            local_4 = -0x16;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,99,"mriStep_SetNonlinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                          ,"Setting convergence test function failed");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x59,"mriStep_SetNonlinearSolver",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                        ,"Setting nonlinear system function failed");
        local_4 = -0x16;
      }
    }
  }
  return local_4;
}

Assistant:

int mriStep_SetNonlinearSolver(ARKodeMem ark_mem, SUNNonlinearSolver NLS)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if NLS input is NULL */
  if (NLS == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The NLS input must be non-NULL");
    return (ARK_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ((NLS->ops->gettype == NULL) || (NLS->ops->solve == NULL) ||
      (NLS->ops->setsysfn == NULL))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (ARK_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(step_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  step_mem->NLS    = NLS;
  step_mem->ownNLS = SUNFALSE;

  /* set the nonlinear residual/fixed-point function, based on solver type */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(step_mem->NLS, mriStep_NlsResidual);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(step_mem->NLS, mriStep_NlsFPFunction);
  }
  else
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid nonlinear solver type");
    return (ARK_ILL_INPUT);
  }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (ARK_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(step_mem->NLS, mriStep_NlsConvTest,
                                     (void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (ARK_ILL_INPUT);
  }

  /* set default nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (ARK_ILL_INPUT);
  }

  /* set the nonlinear system RHS function */
  step_mem->nls_fsi = NULL;

  if (step_mem->implicit_rhs)
  {
    if (!(step_mem->fsi))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "The implicit slow ODE RHS function is NULL");
      return (ARK_ILL_INPUT);
    }
    step_mem->nls_fsi = step_mem->fsi;
  }

  return (ARK_SUCCESS);
}